

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tznames_impl.cpp
# Opt level: O0

int __thiscall
icu_63::TimeZoneNamesImpl::clone
          (TimeZoneNamesImpl *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  TimeZoneNamesImpl *this_00;
  TimeZoneNamesImpl *local_30;
  UErrorCode local_14;
  TimeZoneNamesImpl *pTStack_10;
  UErrorCode status;
  TimeZoneNamesImpl *this_local;
  
  local_14 = U_ZERO_ERROR;
  pTStack_10 = this;
  this_00 = (TimeZoneNamesImpl *)UMemory::operator_new((UMemory *)0x140,(size_t)__fn);
  local_30 = (TimeZoneNamesImpl *)0x0;
  if (this_00 != (TimeZoneNamesImpl *)0x0) {
    TimeZoneNamesImpl(this_00,&this->fLocale,&local_14);
    local_30 = this_00;
  }
  return (int)local_30;
}

Assistant:

TimeZoneNames*
TimeZoneNamesImpl::clone() const {
    UErrorCode status = U_ZERO_ERROR;
    return new TimeZoneNamesImpl(fLocale, status);
}